

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3AddPrimaryKey(Parse *pParse,ExprList *pList,int onError,int autoInc,int sortOrder)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  ushort uVar4;
  int iVar5;
  Table *pTVar6;
  Column *pCVar7;
  Expr *pEVar8;
  u8 uVar9;
  Expr *pEVar10;
  ulong uVar11;
  RenameToken *pRVar12;
  long lVar13;
  Column *pCVar14;
  long lVar15;
  bool bVar16;
  
  pTVar6 = pParse->pNewTable;
  if (pTVar6 != (Table *)0x0) {
    if ((pTVar6->tabFlags & 4) == 0) {
      pTVar6->tabFlags = pTVar6->tabFlags | 4;
      if (pList == (ExprList *)0x0) {
        uVar11 = (long)pTVar6->nCol - 1;
        pCVar7 = pTVar6->aCol;
        pCVar14 = pCVar7 + uVar11;
        uVar4 = pCVar7[uVar11].colFlags;
        pCVar7[uVar11].colFlags = uVar4 | 1;
        bVar16 = true;
        if ((uVar4 & 0x60) != 0) {
          sqlite3ErrorMsg(pParse,"generated columns cannot be part of the PRIMARY KEY");
        }
        goto LAB_001551fb;
      }
      iVar5 = pList->nExpr;
      if (0 < (long)iVar5) {
        uVar11 = 0xffffffff;
        lVar15 = 0;
        pCVar14 = (Column *)0x0;
LAB_0015509b:
        for (pEVar8 = pList->a[lVar15].pExpr; pEVar8 != (Expr *)0x0; pEVar8 = pEVar8->pLeft) {
          if ((pEVar8->flags & 0x2000) == 0) goto LAB_001550b6;
        }
        pEVar8 = (Expr *)0x0;
LAB_001550b6:
        uVar9 = pEVar8->op;
        pEVar10 = pEVar8;
        if (uVar9 == 'u') {
LAB_001550d3:
          pEVar10->op = ';';
          uVar9 = pEVar8->op;
LAB_001550d8:
          if (uVar9 == ';') {
            sVar3 = pTVar6->nCol;
            if (0 < sVar3) {
              uVar11 = 0;
LAB_00155100:
              pCVar7 = pTVar6->aCol + uVar11;
              lVar13 = 0;
              do {
                bVar1 = (pEVar8->u).zToken[lVar13];
                bVar2 = pTVar6->aCol[uVar11].zCnName[lVar13];
                if (bVar1 == bVar2) {
                  if ((ulong)bVar1 == 0) {
                    uVar4 = pCVar7->colFlags;
                    pCVar7->colFlags = uVar4 | 1;
                    pCVar14 = pCVar7;
                    if ((uVar4 & 0x60) != 0) {
                      sqlite3ErrorMsg(pParse,"generated columns cannot be part of the PRIMARY KEY");
                    }
                    goto LAB_00155177;
                  }
                }
                else if (""[bVar1] != ""[bVar2]) goto LAB_00155137;
                lVar13 = lVar13 + 1;
              } while( true );
            }
            uVar11 = 0;
          }
        }
        else {
          if (uVar9 != 'q') goto LAB_001550d8;
          pEVar10 = pEVar8->pLeft;
          if (pEVar10->op == 'u') goto LAB_001550d3;
        }
        goto LAB_00155177;
      }
      goto LAB_0015524d;
    }
    sqlite3ErrorMsg(pParse,"table \"%s\" has more than one primary key",pTVar6->zName);
  }
  goto LAB_00155262;
LAB_00155137:
  uVar11 = uVar11 + 1;
  if (uVar11 == (long)(int)sVar3) goto code_r0x0015513f;
  goto LAB_00155100;
code_r0x0015513f:
  uVar11 = (ulong)(uint)(int)sVar3;
LAB_00155177:
  lVar15 = lVar15 + 1;
  if (lVar15 == iVar5) goto code_r0x00155183;
  goto LAB_0015509b;
code_r0x00155183:
  bVar16 = iVar5 == 1;
LAB_001551fb:
  if ((((bVar16) && (pCVar14 != (Column *)0x0)) && (sortOrder != 1)) &&
     ((pCVar14->field_0x8 & 0xf0) == 0x40)) {
    if ((pList != (ExprList *)0x0) && (1 < pParse->eParseMode)) {
      for (pEVar8 = pList->a[0].pExpr; pEVar8 != (Expr *)0x0; pEVar8 = pEVar8->pLeft) {
        if ((pEVar8->flags & 0x2000) == 0) goto LAB_001552c3;
      }
      pEVar8 = (Expr *)0x0;
LAB_001552c3:
      pRVar12 = pParse->pRename;
      if (pRVar12 != (RenameToken *)0x0) {
        do {
          if ((Expr *)pRVar12->p == pEVar8) {
            pRVar12->p = &pTVar6->iPKey;
            break;
          }
          pRVar12 = pRVar12->pNext;
        } while (pRVar12 != (RenameToken *)0x0);
      }
    }
    pTVar6->tabFlags = pTVar6->tabFlags | autoInc << 3;
    pTVar6->iPKey = (i16)uVar11;
    pTVar6->keyConf = (u8)onError;
    if (pList == (ExprList *)0x0) {
      return;
    }
    pParse->iPkSortOrder = pList->a[0].fg.sortFlags;
    sqlite3HasExplicitNulls(pParse,pList);
    goto LAB_00155267;
  }
LAB_0015524d:
  if (autoInc == 0) {
    sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,onError,(Token *)0x0,
                       (Expr *)0x0,sortOrder,0,'\x02');
    return;
  }
  sqlite3ErrorMsg(pParse,"AUTOINCREMENT is only allowed on an INTEGER PRIMARY KEY");
LAB_00155262:
  if (pList == (ExprList *)0x0) {
    return;
  }
LAB_00155267:
  exprListDeleteNN(pParse->db,pList);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddPrimaryKey(
  Parse *pParse,    /* Parsing context */
  ExprList *pList,  /* List of field names to be indexed */
  int onError,      /* What to do with a uniqueness conflict */
  int autoInc,      /* True if the AUTOINCREMENT keyword is present */
  int sortOrder     /* SQLITE_SO_ASC or SQLITE_SO_DESC */
){
  Table *pTab = pParse->pNewTable;
  Column *pCol = 0;
  int iCol = -1, i;
  int nTerm;
  if( pTab==0 ) goto primary_key_exit;
  if( pTab->tabFlags & TF_HasPrimaryKey ){
    sqlite3ErrorMsg(pParse,
      "table \"%s\" has more than one primary key", pTab->zName);
    goto primary_key_exit;
  }
  pTab->tabFlags |= TF_HasPrimaryKey;
  if( pList==0 ){
    iCol = pTab->nCol - 1;
    pCol = &pTab->aCol[iCol];
    makeColumnPartOfPrimaryKey(pParse, pCol);
    nTerm = 1;
  }else{
    nTerm = pList->nExpr;
    for(i=0; i<nTerm; i++){
      Expr *pCExpr = sqlite3ExprSkipCollate(pList->a[i].pExpr);
      assert( pCExpr!=0 );
      sqlite3StringToId(pCExpr);
      if( pCExpr->op==TK_ID ){
        const char *zCName;
        assert( !ExprHasProperty(pCExpr, EP_IntValue) );
        zCName = pCExpr->u.zToken;
        for(iCol=0; iCol<pTab->nCol; iCol++){
          if( sqlite3StrICmp(zCName, pTab->aCol[iCol].zCnName)==0 ){
            pCol = &pTab->aCol[iCol];
            makeColumnPartOfPrimaryKey(pParse, pCol);
            break;
          }
        }
      }
    }
  }
  if( nTerm==1
   && pCol
   && pCol->eCType==COLTYPE_INTEGER
   && sortOrder!=SQLITE_SO_DESC
  ){
    if( IN_RENAME_OBJECT && pList ){
      Expr *pCExpr = sqlite3ExprSkipCollate(pList->a[0].pExpr);
      sqlite3RenameTokenRemap(pParse, &pTab->iPKey, pCExpr);
    }
    pTab->iPKey = iCol;
    pTab->keyConf = (u8)onError;
    assert( autoInc==0 || autoInc==1 );
    pTab->tabFlags |= autoInc*TF_Autoincrement;
    if( pList ) pParse->iPkSortOrder = pList->a[0].fg.sortFlags;
    (void)sqlite3HasExplicitNulls(pParse, pList);
  }else if( autoInc ){
#ifndef SQLITE_OMIT_AUTOINCREMENT
    sqlite3ErrorMsg(pParse, "AUTOINCREMENT is only allowed on an "
       "INTEGER PRIMARY KEY");
#endif
  }else{
    sqlite3CreateIndex(pParse, 0, 0, 0, pList, onError, 0,
                           0, sortOrder, 0, SQLITE_IDXTYPE_PRIMARYKEY);
    pList = 0;
  }

primary_key_exit:
  sqlite3ExprListDelete(pParse->db, pList);
  return;
}